

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void substSelect(SubstContext *pSubst,Select *p,int doPrior)

{
  Expr *pEVar1;
  bool bVar2;
  int local_34;
  SrcList_item *pSStack_30;
  int i;
  SrcList_item *pItem;
  SrcList *pSrc;
  Select *pSStack_18;
  int doPrior_local;
  Select *p_local;
  SubstContext *pSubst_local;
  
  pSStack_18 = p;
  if (p != (Select *)0x0) {
    do {
      substExprList(pSubst,pSStack_18->pEList);
      substExprList(pSubst,pSStack_18->pGroupBy);
      substExprList(pSubst,pSStack_18->pOrderBy);
      pEVar1 = substExpr(pSubst,pSStack_18->pHaving);
      pSStack_18->pHaving = pEVar1;
      pEVar1 = substExpr(pSubst,pSStack_18->pWhere);
      pSStack_18->pWhere = pEVar1;
      pSStack_30 = pSStack_18->pSrc->a;
      for (local_34 = pSStack_18->pSrc->nSrc; 0 < local_34; local_34 = local_34 + -1) {
        substSelect(pSubst,pSStack_30->pSelect,1);
        if (((byte)(pSStack_30->fg).field_0x1 >> 2 & 1) != 0) {
          substExprList(pSubst,(pSStack_30->u1).pFuncArg);
        }
        pSStack_30 = pSStack_30 + 1;
      }
      bVar2 = false;
      if (doPrior != 0) {
        pSStack_18 = pSStack_18->pPrior;
        bVar2 = pSStack_18 != (Select *)0x0;
      }
    } while (bVar2);
  }
  return;
}

Assistant:

static void substSelect(
  SubstContext *pSubst, /* Description of the substitution */
  Select *p,            /* SELECT statement in which to make substitutions */
  int doPrior           /* Do substitutes on p->pPrior too */
){
  SrcList *pSrc;
  struct SrcList_item *pItem;
  int i;
  if( !p ) return;
  do{
    substExprList(pSubst, p->pEList);
    substExprList(pSubst, p->pGroupBy);
    substExprList(pSubst, p->pOrderBy);
    p->pHaving = substExpr(pSubst, p->pHaving);
    p->pWhere = substExpr(pSubst, p->pWhere);
    pSrc = p->pSrc;
    assert( pSrc!=0 );
    for(i=pSrc->nSrc, pItem=pSrc->a; i>0; i--, pItem++){
      substSelect(pSubst, pItem->pSelect, 1);
      if( pItem->fg.isTabFunc ){
        substExprList(pSubst, pItem->u1.pFuncArg);
      }
    }
  }while( doPrior && (p = p->pPrior)!=0 );
}